

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXModel.cpp
# Opt level: O0

bool __thiscall Assimp::FBX::Model::IsNull(Model *this)

{
  bool bVar1;
  vector<const_Assimp::FBX::NodeAttribute_*,_std::allocator<const_Assimp::FBX::NodeAttribute_*>_>
  *this_00;
  reference ppNVar2;
  long local_58;
  Null *null_tag;
  NodeAttribute *att;
  const_iterator __end2;
  const_iterator __begin2;
  vector<const_Assimp::FBX::NodeAttribute_*,_std::allocator<const_Assimp::FBX::NodeAttribute_*>_>
  *__range2;
  vector<const_Assimp::FBX::NodeAttribute_*,_std::allocator<const_Assimp::FBX::NodeAttribute_*>_>
  *attrs;
  Model *this_local;
  
  this_00 = GetAttributes(this);
  __end2 = std::
           vector<const_Assimp::FBX::NodeAttribute_*,_std::allocator<const_Assimp::FBX::NodeAttribute_*>_>
           ::begin(this_00);
  att = (NodeAttribute *)
        std::
        vector<const_Assimp::FBX::NodeAttribute_*,_std::allocator<const_Assimp::FBX::NodeAttribute_*>_>
        ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_Assimp::FBX::NodeAttribute_*const_*,_std::vector<const_Assimp::FBX::NodeAttribute_*,_std::allocator<const_Assimp::FBX::NodeAttribute_*>_>_>
                                *)&att);
    if (!bVar1) {
      return false;
    }
    ppNVar2 = __gnu_cxx::
              __normal_iterator<const_Assimp::FBX::NodeAttribute_*const_*,_std::vector<const_Assimp::FBX::NodeAttribute_*,_std::allocator<const_Assimp::FBX::NodeAttribute_*>_>_>
              ::operator*(&__end2);
    if (*ppNVar2 == (NodeAttribute *)0x0) {
      local_58 = 0;
    }
    else {
      local_58 = __dynamic_cast(*ppNVar2,&NodeAttribute::typeinfo,&Null::typeinfo,0);
    }
    if (local_58 != 0) break;
    __gnu_cxx::
    __normal_iterator<const_Assimp::FBX::NodeAttribute_*const_*,_std::vector<const_Assimp::FBX::NodeAttribute_*,_std::allocator<const_Assimp::FBX::NodeAttribute_*>_>_>
    ::operator++(&__end2);
  }
  return true;
}

Assistant:

bool Model::IsNull() const
{
    const std::vector<const NodeAttribute*>& attrs = GetAttributes();
    for(const NodeAttribute* att : attrs) {

        const Null* null_tag = dynamic_cast<const Null*>(att);
        if(null_tag) {
            return true;
        }
    }

    return false;
}